

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall CallStatement::evaluate(CallStatement *this,SymTab *symTab)

{
  return;
}

Assistant:

void CallStatement::evaluate(SymTab &symTab){//,std::vector<Function*>stack) {
    //if()
//    std::vector<std::string>params;
//    //params.reserve(testList()->numTests());
//    for(int i = 0; i < testList()->numTests();i++){
//        params.push_back(testList()->at(i)->token().getName());
//    }
//    auto *function = new Function;
//    function->paramenters() = params;
//    std::vector<Function*>functions = getFunctionStack();
//    //Statement *function = passBackFunction();
//    //
//    //Functions *functions
}